

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_setlist(lua_State *L,CallInfo *ci,TValue *ra,int b,int c)

{
  uint nasize;
  double dVar1;
  LuaType LVar2;
  Table *t;
  RaviArray *t_00;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ushort uVar6;
  lua_Integer value;
  uint ukey;
  uint uVar7;
  char *pcVar8;
  TValue *pTVar9;
  int iVar10;
  ulong uVar11;
  lua_Number value_00;
  double dVar12;
  undefined1 auVar13 [16];
  
  if (b == 0) {
    b = (int)((ulong)((long)L->top - (long)ra) >> 4) - 1;
  }
  iVar10 = c * 0x32;
  nasize = iVar10 + -0x32 + b;
  LVar2 = ra->tt_;
  if ((LVar2 == 0x8025) || (LVar2 == 0x8015)) {
    t_00 = (RaviArray *)(ra->value_).gc;
    if ((t_00->tt != '\x15') && (t_00->tt != '%')) {
      pcVar8 = 
      "((((ra)->value_).gc)->tt == ((5) | ((1) << 4)) || (((ra)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_0012feb4;
    }
    uVar7 = iVar10 - 0x31;
    if ((int)uVar7 <= (int)nasize) {
      pTVar9 = ra + (long)(iVar10 + -0x32) + 1;
      do {
        LVar2 = pTVar9->tt_;
        if ((t_00->flags & 8) == 0) {
          uVar6 = 1;
          if (LVar2 == 3) {
            dVar1 = (pTVar9->value_).n;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = dVar1;
            auVar13 = vroundsd_avx(auVar13,auVar13,9);
            dVar12 = auVar13._0_8_;
            if ((dVar12 != dVar1) || (NAN(dVar12) || NAN(dVar1))) goto LAB_0012fdf6;
            uVar4 = vcmppd_avx512vl(auVar13,ZEXT816(0x43e0000000000000),5);
            uVar5 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar13,6);
            uVar6 = (ushort)uVar5 & 3 | (ushort)uVar4 & 3;
            if ((uVar6 & 1) == 0) {
              value = (lua_Integer)dVar12;
            }
            else {
              value = 0;
            }
LAB_0012fdf8:
            if ((uVar6 & 1) != 0) {
              pcVar8 = "value cannot be converted to integer";
LAB_0012fe7b:
              luaG_runerror(L,pcVar8);
            }
          }
          else {
            if (LVar2 != 0x13) {
LAB_0012fdf6:
              value = 0;
              goto LAB_0012fdf8;
            }
            value = (pTVar9->value_).i;
          }
          if (uVar7 < t_00->len) {
            *(lua_Integer *)(t_00->data + (ulong)uVar7 * 8) = value;
          }
          else {
            raviH_set_int(L,t_00,(ulong)uVar7,value);
          }
        }
        else {
          if (LVar2 == 0x13) {
            value_00 = (lua_Number)(pTVar9->value_).i;
          }
          else {
            if (LVar2 != 3) {
              pcVar8 = "value cannot be converted to number";
              goto LAB_0012fe7b;
            }
            value_00 = (pTVar9->value_).n;
          }
          if (uVar7 < t_00->len) {
            *(lua_Number *)(t_00->data + (ulong)uVar7 * 8) = value_00;
          }
          else {
            raviH_set_float(L,t_00,(ulong)uVar7,value_00);
          }
        }
        uVar7 = uVar7 + 1;
        pTVar9 = pTVar9 + 1;
        b = b - 1;
      } while (b != 0);
    }
  }
  else {
    if (LVar2 != 0x8005) {
      pcVar8 = 
      "(((((ra))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((ra))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_0012feb4:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb08,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
    }
    t = (Table *)(ra->value_).gc;
    if (t->tt != '\x05') {
      __assert_fail("(((ra)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xafe,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
    }
    if (t->sizearray < nasize) {
      luaH_resizearray(L,t,nasize);
    }
    if (0 < b) {
      pTVar9 = ra + (uint)b;
      uVar11 = (ulong)(uint)b;
      do {
        luaH_setint(L,t,(ulong)(uint)(iVar10 + -0x32 + (int)uVar11),pTVar9);
        if ((short)pTVar9->tt_ < 0) {
          if (9 < (t->tt & 0xe)) {
            __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb04,
                          "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
          }
          if (((t->marked & 0x20) != 0) && ((((pTVar9->value_).gc)->marked & 0x18) != 0)) {
            luaC_barrierback_(L,(GCObject *)t);
          }
        }
        pTVar9 = pTVar9 + -1;
        bVar3 = 1 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar3);
    }
  }
  L->top = ci->top;
  return;
}

Assistant:

void raviV_op_setlist(lua_State *L, CallInfo *ci, TValue *ra, int b, int c) {
  int n = b;
  unsigned int last;
  if (n == 0)
    n = cast_int(L->top - ra) - 1;
  last = ((c - 1) * LFIELDS_PER_FLUSH) + n;
  if (ttisLtable(ra)) {
    Table *h = hvalue(ra);
    if (last > h->sizearray)        /* needs more space? */
      luaH_resizearray(L, h, last); /* pre-allocate it at once */
    for (; n > 0; n--) {
      TValue *val = ra + n;
      luaH_setint(L, h, last--, val);
      luaC_barrierback(L, obj2gco(h), val);
    }
  }
  else {
    RaviArray *h = arrvalue(ra);
    int i = last - n + 1;
    for (; i <= (int)last; i++) {
      TValue *val = ra + i;
      unsigned int u = (unsigned int)(i);
      if ((h->flags & RAVI_ARRAY_ISFLOAT) == 0) {
        if (ttisinteger(val)) {
          raviH_set_int_inline(L, h, u, ivalue(val));
        }
        else {
          lua_Integer i = 0;
          if (tointegerns(val, &i)) {
            raviH_set_int_inline(L, h, u, i);
          }
          else
            luaG_runerror(L, "value cannot be converted to integer");
        }
      }
      else {
        if (ttisfloat(val)) {
          raviH_set_float_inline(L, h, u, fltvalue(val));
        }
        else if (ttisinteger(val)) {
          raviH_set_float_inline(L, h, u, (lua_Number)(ivalue(val)));
        }
        else {
          lua_Number d = 0.0;
          if (tonumberns(val, d)) {
            raviH_set_float_inline(L, h, u, d);
          }
          else
            luaG_runerror(L, "value cannot be converted to number");
        }
      }
    }
  }
  L->top = ci->top; /* correct top (in case of previous open call) */
}